

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

errr finish_parse_player_prop(parser *p)

{
  player_bound_ui **pppVar1;
  player_bound_ui *ppVar2;
  embryo_player_ability *peVar3;
  int iVar4;
  player_ability *ppVar5;
  char *pcVar6;
  char *pcVar7;
  player_ability *ppVar8;
  long lVar9;
  embryo_player_ability *p_00;
  player_bound_ui **pppVar10;
  
  p_00 = embryo_player_abilities;
  embryo_player_abilities = (embryo_player_ability *)0x0;
  player_abilities = (player_ability *)mem_zalloc(0x30);
  ppVar8 = player_abilities;
  while (p_00 != (embryo_player_ability *)0x0) {
    pcVar6 = (p_00->ability).type;
    iVar4 = strcmp(pcVar6,"element");
    ppVar5 = ppVar8;
    if (iVar4 == 0) {
      pppVar1 = &p_00->boundui;
      for (lVar9 = 0; lVar9 != 0x19; lVar9 = lVar9 + 1) {
        pcVar6 = string_make(projections[lVar9].name);
        ppVar5->index = (uint16_t)lVar9;
        pcVar7 = string_make((p_00->ability).type);
        ppVar5->type = pcVar7;
        pcVar7 = format("%s %s.",(p_00->ability).desc,pcVar6);
        pcVar7 = string_make(pcVar7);
        ppVar5->desc = pcVar7;
        my_strcap(pcVar6);
        pcVar7 = format("%s %s",pcVar6,(p_00->ability).name);
        pcVar7 = string_make(pcVar7);
        ppVar5->name = pcVar7;
        string_free(pcVar6);
        ppVar5->value = (p_00->ability).value;
        pppVar10 = pppVar1;
        while (ppVar2 = *pppVar10, ppVar2 != (player_bound_ui *)0x0) {
          pcVar6 = format("%s<%s>",ppVar2->name,list_element_names[lVar9]);
          pcVar6 = string_make(pcVar6);
          bind_player_ability_to_ui_entry_by_name
                    (pcVar6,ppVar5,ppVar2->value,(_Bool)(ppVar2->isspecial ^ 1),ppVar2->isaux);
          string_free(pcVar6);
          pppVar10 = &ppVar2->next;
        }
        if ((lVar9 != 0x18) || (ppVar8 = ppVar5, p_00->next != (embryo_player_ability *)0x0)) {
          ppVar8 = (player_ability *)mem_zalloc(0x30);
          ppVar5->next = ppVar8;
        }
        ppVar5 = ppVar8;
      }
      string_free((p_00->ability).type);
      string_free((p_00->ability).desc);
      string_free((p_00->ability).name);
      while (ppVar2 = *pppVar1, ppVar2 != (player_bound_ui *)0x0) {
        *pppVar1 = ppVar2->next;
        string_free(ppVar2->name);
        mem_free(ppVar2);
      }
    }
    else {
      ppVar8->type = pcVar6;
      ppVar8->index = (p_00->ability).index;
      pcVar6 = (p_00->ability).desc;
      ppVar8->name = (p_00->ability).name;
      ppVar8->desc = pcVar6;
      while (ppVar2 = p_00->boundui, ppVar2 != (player_bound_ui *)0x0) {
        p_00->boundui = ppVar2->next;
        bind_player_ability_to_ui_entry_by_name
                  (ppVar2->name,ppVar8,ppVar2->value,(_Bool)(ppVar2->isspecial ^ 1),ppVar2->isaux);
        string_free(ppVar2->name);
        mem_free(ppVar2);
      }
      if (p_00->next != (embryo_player_ability *)0x0) {
        ppVar5 = (player_ability *)mem_zalloc(0x30);
        ppVar8->next = ppVar5;
      }
    }
    peVar3 = p_00->next;
    mem_free(p_00);
    ppVar8 = ppVar5;
    p_00 = peVar3;
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_player_prop(struct parser *p) {
	struct embryo_player_ability *embryo = embryo_player_abilities;
	struct embryo_player_ability *target;
	struct player_bound_ui *boundui_cursor;
	struct player_ability *new, *previous = NULL;

	embryo_player_abilities = NULL;
	/* Copy abilities over, making multiple copies for element types */
	player_abilities = mem_zalloc(sizeof(*player_abilities));
	new = player_abilities;
	while (embryo) {
		if (streq(embryo->ability.type, "element")) {
			uint16_t i, n;
			assert(N_ELEMENTS(list_element_names) < 65536);
			n = (uint16_t) N_ELEMENTS(list_element_names);
			for (i = 0; i < n - 1; i++) {
				char *name = string_make(projections[i].name);
				new->index = i;
				new->type = string_make(embryo->ability.type);
				new->desc = string_make(format("%s %s.", embryo->ability.desc, name));
				my_strcap(name);
				new->name = string_make(format("%s %s", name, embryo->ability.name));
				string_free(name);
				new->value = embryo->ability.value;
				boundui_cursor = embryo->boundui;
				while (boundui_cursor) {
					name = string_make(format("%s<%s>", boundui_cursor->name, list_element_names[i]));
					(void) bind_player_ability_to_ui_entry_by_name(name, new, boundui_cursor->value, !boundui_cursor->isspecial, boundui_cursor->isaux);
					string_free(name);
					boundui_cursor = boundui_cursor->next;
				}
				if ((i != n - 2) || embryo->next) {
					previous = new;
					new = mem_zalloc(sizeof(*new));
					previous->next = new;
				}
			}
			string_free(embryo->ability.type);
			string_free(embryo->ability.desc);
			string_free(embryo->ability.name);
			while (embryo->boundui) {
				boundui_cursor = embryo->boundui;
				embryo->boundui = embryo->boundui->next;
				string_free(boundui_cursor->name);
				mem_free(boundui_cursor);
			}
		} else {
			new->type = embryo->ability.type;
			new->index = embryo->ability.index;
			new->desc = embryo->ability.desc;
			new->name = embryo->ability.name;
			while (embryo->boundui) {
				boundui_cursor = embryo->boundui;
				embryo->boundui = embryo->boundui->next;
				(void) bind_player_ability_to_ui_entry_by_name(boundui_cursor->name, new, boundui_cursor->value, !boundui_cursor->isspecial, boundui_cursor->isaux);
				string_free(boundui_cursor->name);
				mem_free(boundui_cursor);
			}
			if (embryo->next) {
				previous = new;
				new = mem_zalloc(sizeof(*new));
				previous->next = new;
			}
		}
		target = embryo;
		embryo = embryo->next;
		mem_free(target);
	}
	parser_destroy(p);
	return 0;
}